

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_threads.cc
# Opt level: O0

void __thiscall AllReduceSync::AllReduceSync(AllReduceSync *this,size_t total)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  condition_variable *this_00;
  ulong uVar3;
  ulong in_RSI;
  undefined8 *in_RDI;
  
  in_RDI[2] = in_RSI;
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined1 *)((long)in_RDI + 0x1c) = 1;
  pvVar2 = operator_new(0x28);
  std::mutex::mutex((mutex *)0x3e5d32);
  *in_RDI = pvVar2;
  this_00 = (condition_variable *)operator_new(0x30);
  std::condition_variable::condition_variable(this_00);
  in_RDI[1] = this_00;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar3);
  in_RDI[4] = pvVar2;
  return;
}

Assistant:

AllReduceSync::AllReduceSync(const size_t total) : m_total(total), m_count(0), m_run(true)
{
  m_mutex = new mutex;
  m_cv = new condition_variable;
  buffers = new void*[total];
}